

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  FILE *__stream;
  size_t sVar1;
  uchar *__ptr;
  uint uVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    uVar2 = 0x4e;
  }
  else {
    sVar1 = lodepng_filesize((FILE *)__stream);
    if ((long)sVar1 < 0) {
      uVar2 = 0x4e;
    }
    else {
      *outsize = sVar1;
      __ptr = (uchar *)malloc(sVar1);
      *out = __ptr;
      uVar2 = 0x53;
      if (sVar1 == 0 || __ptr != (uchar *)0x0) {
        sVar1 = fread(__ptr,1,sVar1,__stream);
        uVar2 = 0x4e;
        if (sVar1 == *outsize) {
          uVar2 = 0;
        }
      }
    }
    fclose(__stream);
  }
  return uVar2;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename) {
  unsigned error;
  FILE* file = fopen(filename, "rb");
  if(!file) return 78;
  error = lodepng_load_file_(out, outsize, file);
  fclose(file);
  return error;
}